

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2LDRDPreInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint64_t Address_00;
  uint uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  DecodeStatus DVar6;
  
  uVar1 = Insn >> 0xc & 0xf;
  uVar4 = Insn >> 8 & 0xf;
  uVar3 = Insn >> 0x10 & 0xf;
  Decoder_00 = (void *)(ulong)(Insn & 0x1200000);
  DVar6 = (uint)(uVar3 != uVar4) * 2 | MCDisassembler_SoftFail;
  if (uVar3 == uVar1) {
    DVar6 = MCDisassembler_SoftFail;
  }
  DVar5 = MCDisassembler_Success;
  if ((Insn & 0x1200000) != 0x1000000) {
    DVar5 = DVar6;
  }
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar3]);
  if (uVar1 == uVar4) {
    DVar5 = MCDisassembler_SoftFail;
  }
  uVar1 = ~Insn;
  if ((uVar1 & 0xd000) == 0) {
    DVar5 = MCDisassembler_SoftFail;
  }
  if ((uVar1 & 0xd00) == 0) {
    DVar5 = MCDisassembler_SoftFail;
  }
  if ((uVar1 & 0xd0000) == 0) {
    DVar5 = MCDisassembler_SoftFail;
  }
  DVar2 = DecodeT2AddrModeImm8s4
                    (Inst,uVar3 << 9 | Insn >> 0xf & 0x100 | Insn & 0xff,Address_00,Decoder_00);
  DVar6 = DVar2;
  if (((DVar2 != MCDisassembler_Fail) && (DVar6 = DVar5, DVar2 != MCDisassembler_Success)) &&
     (DVar6 = DVar2, DVar2 != MCDisassembler_SoftFail)) {
    DVar6 = MCDisassembler_Fail;
  }
  return DVar6;
}

Assistant:

static DecodeStatus DecodeT2LDRDPreInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 8, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	bool writeback = (W == 1) | (P == 0);

	addr |= (U << 8) | (Rn << 9);

	if (writeback && (Rn == Rt || Rn == Rt2))
		Check(&S, MCDisassembler_SoftFail);
	if (Rt == Rt2)
		Check(&S, MCDisassembler_SoftFail);

	// Rt
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	// Rt2
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	// Writeback operand
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	// addr
	if (!Check(&S, DecodeT2AddrModeImm8s4(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}